

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void tplt_print(FILE *out,lemon *lemp,char *str,int *lineno)

{
  int iVar1;
  char cVar2;
  
  if (str == (char *)0x0) {
    return;
  }
  do {
    cVar2 = *str;
    if (cVar2 == '\n') {
      *lineno = *lineno + 1;
      cVar2 = *str;
    }
    else if (cVar2 == '\0') {
      if (str[-1] != '\n') {
        putc(10,(FILE *)out);
        *lineno = *lineno + 1;
      }
      if (lemp->nolinenosflag != 0) {
        return;
      }
      iVar1 = *lineno;
      *lineno = iVar1 + 1;
      tplt_linedir(out,iVar1 + 1,lemp->outname);
      return;
    }
    putc((int)cVar2,(FILE *)out);
    str = str + 1;
  } while( true );
}

Assistant:

PRIVATE void tplt_print(FILE *out, struct lemon *lemp, char *str, int *lineno)
{
  if( str==0 ) return;
  while( *str ){
    if( *str=='\n' ) (*lineno)++;
    putc(*str,out);
    str++;
  }
  if( str[-1]!='\n' ){
    putc('\n',out);
    (*lineno)++;
  }
  if (!lemp->nolinenosflag) {
	(*lineno)++; tplt_linedir(out,*lineno,lemp->outname);
  }

  return;
}